

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O0

void __thiscall
Assimp::IFC::Schema_2x3::IfcEnergyConversionDevice::IfcEnergyConversionDevice
          (IfcEnergyConversionDevice *this)

{
  IfcEnergyConversionDevice *this_local;
  
  STEP::Object::Object
            ((Object *)&(this->super_IfcDistributionFlowElement).field_0x168,
             "IfcEnergyConversionDevice");
  IfcDistributionFlowElement::IfcDistributionFlowElement
            (&this->super_IfcDistributionFlowElement,&PTR_construction_vtable_24__00e9e368);
  STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcEnergyConversionDevice,_0UL>::ObjectHelper
            ((ObjectHelper<Assimp::IFC::Schema_2x3::IfcEnergyConversionDevice,_0UL> *)
             &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.field_0x158,
             &PTR_construction_vtable_24__00e9e4f0);
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.super_IfcObject = 0xe9e210;
  *(undefined8 *)&(this->super_IfcDistributionFlowElement).field_0x168 = 0xe9e350;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0x88 = 0xe9e238;
  (this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
  super_IfcProduct.super_IfcObject.super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>.
  _vptr_ObjectHelper = (_func_int **)0xe9e260;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.super_IfcObject.field_0xd0 = 0xe9e288;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    super_IfcProduct.field_0x100 = 0xe9e2b0;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    field_0x138 = 0xe9e2d8;
  *(undefined8 *)
   &(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.super_IfcElement.
    field_0x148 = 0xe9e300;
  *(undefined8 *)&(this->super_IfcDistributionFlowElement).super_IfcDistributionElement.field_0x158
       = 0xe9e328;
  return;
}

Assistant:

IfcEnergyConversionDevice() : Object("IfcEnergyConversionDevice") {}